

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxStateByIndex::Resolve(FxStateByIndex *this,FCompileContext *ctx)

{
  bool bVar1;
  int val;
  PClassActor *pPVar2;
  char *pcVar3;
  FState *ptr;
  FxExpression *x;
  int symlabel;
  PClassActor *aclass;
  FCompileContext *ctx_local;
  FxStateByIndex *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (ctx->Class == (PStruct *)0x0) {
      if (this != (FxStateByIndex *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxStateByIndex *)0x0;
    }
    else {
      pPVar2 = dyn_cast<PClassActor>((DObject *)ctx->Class);
      bVar1 = false;
      if (pPVar2 != (PClassActor *)0x0) {
        bVar1 = 0 < pPVar2->NumOwnedStates;
      }
      if (!bVar1) {
        __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x25f6,"virtual FxExpression *FxStateByIndex::Resolve(FCompileContext &)");
      }
      if (this->index < pPVar2->NumOwnedStates) {
        ptr = pPVar2->OwnedStates + this->index;
        val = FStateLabelStorage::AddPointer(&StateLabels,ptr);
        this_local = (FxStateByIndex *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ptr);
        FxConstant::FxConstant
                  ((FxConstant *)this_local,val,&(this->super_FxExpression).ScriptPosition);
        (((FxConstant *)this_local)->super_FxExpression).ValueType = (PType *)TypeStateLabel;
        if (this != (FxStateByIndex *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
      }
      else {
        pcVar3 = FName::GetChars(&(ctx->Class->super_PNamedType).TypeName);
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "%s: Attempt to jump to non existing state index %d",pcVar3,
                   (ulong)(uint)this->index);
        if (this != (FxStateByIndex *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxStateByIndex *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxStateByIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	ABORT(ctx.Class);
	auto aclass = dyn_cast<PClassActor>(ctx.Class);

	// This expression type can only be used from actors, for everything else it has already produced a compile error.
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);

	if (aclass->NumOwnedStates <= index)
	{
		ScriptPosition.Message(MSG_ERROR, "%s: Attempt to jump to non existing state index %d", 
			ctx.Class->TypeName.GetChars(), index);
		delete this;
		return nullptr;
	}
	int symlabel = StateLabels.AddPointer(aclass->OwnedStates + index);
	FxExpression *x = new FxConstant(symlabel, ScriptPosition);
	x->ValueType = TypeStateLabel;
	delete this;
	return x;
}